

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void nak(int error)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ssize_t sVar4;
  errmsg *local_28;
  errmsg *pe;
  int length;
  tftphdr *tp;
  int error_local;
  
  buf.hdr.th_opcode = htons(5);
  buf._2_2_ = htons((uint16_t)error);
  for (local_28 = errmsgs; (-1 < local_28->e_code && (local_28->e_code != error));
      local_28 = local_28 + 1) {
  }
  if (local_28->e_code < 0) {
    pcVar2 = strerror(error + -100);
    local_28->e_msg = pcVar2;
    buf._2_2_ = 0;
  }
  sVar3 = strlen(local_28->e_msg);
  memcpy((void *)((long)&buf.hdr.th_u1 + 2),local_28->e_msg,(long)((int)sVar3 + 1));
  iVar1 = (int)sVar3 + 5;
  sVar4 = send(peer,&buf,(long)iVar1,0x4000);
  if (sVar4 != iVar1) {
    logmsg("nak: fail\n");
  }
  return;
}

Assistant:

static void nak(int error)
{
  struct tftphdr *tp;
  int length;
  struct errmsg *pe;

  tp = &buf.hdr;
  tp->th_opcode = htons((unsigned short)opcode_ERROR);
  tp->th_code = htons((unsigned short)error);
  for (pe = errmsgs; pe->e_code >= 0; pe++)
    if (pe->e_code == error)
      break;
  if (pe->e_code < 0) {
    pe->e_msg = strerror(error - 100);
    tp->th_code = EUNDEF;   /* set 'undef' errorcode */
  }
  length = (int)strlen(pe->e_msg);

  /* we use memcpy() instead of strcpy() in order to avoid buffer overflow
   * report from glibc with FORTIFY_SOURCE */
  memcpy(tp->th_msg, pe->e_msg, length + 1);
  length += 5;
  if (swrite(peer, &buf.storage[0], length) != length)
    logmsg("nak: fail\n");
}